

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testValidScale(void)

{
  RepeatedField<long> *this;
  RepeatedField<float> *pRVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  ConvolutionLayerParams *pCVar6;
  long lVar7;
  bool bVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  long *plVar11;
  FeatureDescription *pFVar12;
  NeuralNetworkLayer *pNVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  void *pvVar15;
  ScaleLayerParams *pSVar16;
  unsigned_long *puVar17;
  WeightParams *pWVar18;
  float *pfVar19;
  ostream *poVar20;
  undefined8 *puVar21;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar22;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  int iVar23;
  Arena *pAVar24;
  Model m1;
  Result res;
  Model MStack_78;
  Result local_48;
  
  CoreML::Specification::Model::Model(&MStack_78,(Arena *)0x0,false);
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar24 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar24);
  }
  pRVar4 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019f99a:
    pRVar22 = &(MStack_78.description_)->input_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar22->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar22->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar23 = ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_0019f99a;
    ((MStack_78.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar15 = pRVar4->elements[iVar23];
  }
  puVar21 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar21 = (undefined8 *)*puVar21;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"input",puVar21);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar24 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar24);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar24);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  this = &pAVar10->shape_;
  uVar2 = (pAVar10->shape_).current_size_;
  uVar3 = (pAVar10->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
  }
  plVar11 = google::protobuf::RepeatedField<long>::elements(this);
  plVar11[uVar2] = 1;
  this->current_size_ = uVar2 + 1;
  if (MStack_78.description_ == (ModelDescription *)0x0) {
    pAVar24 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    MStack_78.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar24);
  }
  pRVar4 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019faac:
    pRVar22 = &(MStack_78.description_)->output_;
    pFVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar22->super_RepeatedPtrFieldBase).arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar22->super_RepeatedPtrFieldBase,pFVar12);
  }
  else {
    iVar23 = ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_0019faac;
    ((MStack_78.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar15 = pRVar4->elements[iVar23];
  }
  puVar21 = (undefined8 *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
    puVar21 = (undefined8 *)*puVar21;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar15 + 0x10),"probs",puVar21);
  if (*(long *)((long)pvVar15 + 0x20) == 0) {
    pAVar24 = (Arena *)(*(ulong *)((long)pvVar15 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar15 + 8) & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar24);
    *(FeatureType **)((long)pvVar15 + 0x20) = pFVar9;
  }
  pFVar9 = *(FeatureType **)((long)pvVar15 + 0x20);
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    uVar5 = (pFVar9->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar24);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  if (MStack_78._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&MStack_78);
    MStack_78._oneof_case_[0] = 500;
    pAVar24 = (Arena *)(MStack_78.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_78.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    MStack_78.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar24);
  }
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(MStack_78.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019fb9c:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(MStack_78.Type_.pipeline_)->models_;
    pNVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar13 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar13);
  }
  else {
    iVar23 = (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_0019fb9c;
    (MStack_78.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar23 + 1;
    pNVar13 = (NeuralNetworkLayer *)pRVar4->elements[iVar23];
  }
  pRVar4 = (pNVar13->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0019fbd4:
    pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar13->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar13->input_).super_RepeatedPtrFieldBase,pbVar14);
  }
  else {
    iVar23 = (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar23) goto LAB_0019fbd4;
    (pNVar13->input_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
    pvVar15 = pRVar4->elements[iVar23];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3cb973);
  pRVar4 = (pNVar13->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar23 = (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar23 < pRVar4->allocated_size) {
      (pNVar13->output_).super_RepeatedPtrFieldBase.current_size_ = iVar23 + 1;
      pvVar15 = pRVar4->elements[iVar23];
      goto LAB_0019fc3e;
    }
  }
  pbVar14 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar13->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar15 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar13->output_).super_RepeatedPtrFieldBase,pbVar14);
LAB_0019fc3e:
  std::__cxx11::string::_M_replace((ulong)pvVar15,0,*(char **)((long)pvVar15 + 8),0x3b872d);
  if (pNVar13->_oneof_case_[0] != 0xf5) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar13);
    pNVar13->_oneof_case_[0] = 0xf5;
    uVar5 = (pNVar13->super_MessageLite)._internal_metadata_.ptr_;
    pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar24 = *(Arena **)pAVar24;
    }
    pSVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ScaleLayerParams>
                        (pAVar24);
    (pNVar13->layer_).scale_ = pSVar16;
  }
  pCVar6 = (pNVar13->layer_).convolution_;
  uVar2 = (pCVar6->kernelsize_).current_size_;
  uVar3 = (pCVar6->kernelsize_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar6->kernelsize_,uVar3 + 1);
  }
  puVar17 = google::protobuf::RepeatedField<unsigned_long>::elements(&pCVar6->kernelsize_);
  puVar17[uVar2] = 5;
  (pCVar6->kernelsize_).current_size_ = uVar2 + 1;
  iVar23 = 5;
  do {
    lVar7._0_4_ = (pCVar6->dilationfactor_).current_size_;
    lVar7._4_4_ = (pCVar6->dilationfactor_).total_size_;
    if (lVar7 == 0) {
      uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
      pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar24 = *(Arena **)pAVar24;
      }
      pWVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar24);
      *(WeightParams **)&pCVar6->dilationfactor_ = pWVar18;
    }
    lVar7 = *(long *)&pCVar6->dilationfactor_;
    pRVar1 = (RepeatedField<float> *)(lVar7 + 0x10);
    uVar2 = *(uint *)(lVar7 + 0x10);
    if (uVar2 == *(uint *)(lVar7 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,*(uint *)(lVar7 + 0x14) + 1);
    }
    pfVar19 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar19[uVar2] = 1.0;
    pRVar1->current_size_ = uVar2 + 1;
    iVar23 = iVar23 + -1;
  } while (iVar23 != 0);
  uVar2 = (pCVar6->stride_).current_size_;
  uVar3 = (pCVar6->stride_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&pCVar6->stride_,uVar3 + 1);
  }
  puVar17 = google::protobuf::RepeatedField<unsigned_long>::elements(&pCVar6->stride_);
  puVar17[uVar2] = 3;
  (pCVar6->stride_).current_size_ = uVar2 + 1;
  *(undefined1 *)&(pCVar6->_dilationfactor_cached_byte_size_).super___atomic_base<int>._M_i = 1;
  iVar23 = 3;
  do {
    if ((pCVar6->dilationfactor_).arena_or_elements_ == (void *)0x0) {
      uVar5 = (pCVar6->super_MessageLite)._internal_metadata_.ptr_;
      pAVar24 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar24 = *(Arena **)pAVar24;
      }
      pWVar18 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar24);
      (pCVar6->dilationfactor_).arena_or_elements_ = pWVar18;
    }
    pvVar15 = (pCVar6->dilationfactor_).arena_or_elements_;
    pRVar1 = (RepeatedField<float> *)((long)pvVar15 + 0x10);
    uVar2 = *(uint *)((long)pvVar15 + 0x10);
    if (uVar2 == *(uint *)((long)pvVar15 + 0x14)) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,*(uint *)((long)pvVar15 + 0x14) + 1);
    }
    pfVar19 = google::protobuf::RepeatedField<float>::elements(pRVar1);
    pfVar19[uVar2] = 1.0;
    pRVar1->current_size_ = uVar2 + 1;
    iVar23 = iVar23 + -1;
  } while (iVar23 != 0);
  CoreML::validate<(MLModelType)500>(&local_48,&MStack_78);
  bVar8 = CoreML::Result::good(&local_48);
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar20 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xd79);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
    std::ostream::put((char)poVar20);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_78);
  return (uint)!bVar8;
}

Assistant:

int testValidScale() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *scaleLayer = nn->add_layers();
    scaleLayer->add_input("input");
    scaleLayer->add_output("probs");
    auto *params = scaleLayer->mutable_scale();
    int num_channel = 5;
    params->add_shapescale(num_channel);

    for (int i = 0; i < num_channel; i++) {
        params->mutable_scale()->add_floatvalue(1.0);
    }

    int num_bias = 3;
    params->add_shapebias(num_bias);
    params->set_hasbias(true);
    for (int i = 0; i < num_bias; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}